

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_255_255_4_2(void)

{
  int iVar1;
  uint8_t ciphertext_expected [32];
  uint8_t plaintext [32];
  uint8_t key [32];
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)0x8100d6b653be207c,(uint8_t *)0x5e757bc9b461b161,
                    (uint8_t *)0xd7b03185fb6459c6,(uint8_t *)0xc42749d69ba402a4);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_255_255_4_2(void) {
  const uint8_t key[32] = {
      0x7c, 0x20, 0xbe, 0x53, 0xb6, 0xd6, 0x0,  0x81, 0x49, 0xe1, 0x9a,
      0x34, 0xb9, 0x7d, 0x96, 0x84, 0xa0, 0x91, 0x4c, 0xaf, 0x9f, 0x7f,
      0x38, 0xb2, 0x49, 0x98, 0x11, 0x36, 0x9c, 0x3f, 0x53, 0xda,
  };
  const uint8_t plaintext[32] = {
      0x88, 0x63, 0xf1, 0x29, 0xc0, 0x38, 0x7a, 0xe5, 0xa4, 0x2,  0xa4,
      0x9b, 0xd6, 0x49, 0x27, 0xc4, 0xc6, 0x59, 0x64, 0xfb, 0x85, 0x31,
      0xb0, 0xd7, 0x61, 0xb1, 0x61, 0xb4, 0xc9, 0x7b, 0x75, 0x5e,
  };
  const uint8_t ciphertext_expected[32] = {
      0x3, 0xb6, 0xe4, 0xb6, 0x3c, 0xc8, 0xb0, 0x82, 0x68, 0xb6, 0x78, 0x1d, 0x5a, 0x62, 0x9d, 0x6e,
      0x3, 0x2,  0xc,  0x1c, 0x4,  0x8d, 0x46, 0x84, 0x16, 0x1b, 0x90, 0xad, 0x73, 0x33, 0x91, 0x26,
  };

  return lowmc_enc(&parameters_255_255_4, key, plaintext, ciphertext_expected);
}